

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmCommandExists(void *arg,char *name)

{
  cmState *this;
  allocator<char> local_59;
  string local_58;
  Command local_38;
  
  this = cmMakefile::GetState((cmMakefile *)arg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_59);
  cmState::GetCommand(&local_38,this,&local_58);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  std::__cxx11::string::~string((string *)&local_58);
  return (int)(local_38.super__Function_base._M_manager != (_Manager_type)0x0);
}

Assistant:

static int CCONV cmCommandExists(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return static_cast<int>(mf->GetState()->GetCommand(name) ? 1 : 0);
}